

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glx_gles2.c
# Opt level: O0

int main(void)

{
  int iVar1;
  ulong uVar2;
  XVisualInfo *visinfo;
  GLXFBConfig p_Var3;
  Window WVar4;
  undefined8 uVar5;
  int local_60;
  int local_5c;
  GLuint q;
  GLuint shader;
  int context_attribs [7];
  GLXFBConfig config;
  GLXContext ctx;
  Window win;
  XVisualInfo *vis;
  _Bool pass;
  
  _q = 0x400009126;
  context_attribs[0] = 0x2091;
  context_attribs[1] = 2;
  context_attribs[2] = 0x2092;
  context_attribs[3] = 0;
  context_attribs[4] = 0;
  dpy = get_display_or_skip();
  uVar2 = epoxy_has_glx_extension(dpy,0,"GLX_EXT_create_context_es2_profile");
  if ((uVar2 & 1) == 0) {
    errx(0x4d,"Test requires GLX_EXT_create_context_es2_profile");
  }
  visinfo = get_glx_visual(dpy);
  p_Var3 = get_fbconfig_for_visinfo(dpy,visinfo);
  WVar4 = get_glx_window(dpy,visinfo,false);
  uVar5 = (*_epoxy_glXCreateContextAttribsARB)(dpy,p_Var3,0,1,&q);
  (*_epoxy_glXMakeCurrent)(dpy,WVar4,uVar5);
  uVar2 = epoxy_is_desktop_gl();
  if ((uVar2 & 1) != 0) {
    errx(1,"GLES2 context creation made a desktop context\n");
  }
  iVar1 = epoxy_gl_version();
  if (iVar1 < 0x14) {
    iVar1 = epoxy_gl_version();
    errx((double)((float)iVar1 / 10.0),1,"GLES2 context creation made a version %f context\n");
  }
  local_5c = (*_epoxy_glCreateShader)(0x8b30);
  if (local_5c == 0) {
    errx(1,"glCreateShader() failed\n");
  }
  (*_epoxy_glDeleteShader)(local_5c);
  iVar1 = epoxy_gl_version();
  if (0x1d < iVar1) {
    local_60 = 0;
    (*_epoxy_glGenQueries)(1,&local_60);
    if (local_60 == 0) {
      errx(1,"glGenQueries() failed\n");
    }
    (*_epoxy_glDeleteQueries)(1,&local_60);
  }
  return 0;
}

Assistant:

int main(void)
{
    bool pass = true;
    XVisualInfo *vis;
    Window win;
    GLXContext ctx;
    GLXFBConfig config;
    int context_attribs[] = {
        GLX_CONTEXT_PROFILE_MASK_ARB, GLX_CONTEXT_ES2_PROFILE_BIT_EXT,
        GLX_CONTEXT_MAJOR_VERSION_ARB, 2,
        GLX_CONTEXT_MINOR_VERSION_ARB, 0,
        0
    };
    GLuint shader;

    dpy = get_display_or_skip();

    if (!epoxy_has_glx_extension(dpy, 0, "GLX_EXT_create_context_es2_profile"))
        errx(77, "Test requires GLX_EXT_create_context_es2_profile");

    vis = get_glx_visual(dpy);
    config = get_fbconfig_for_visinfo(dpy, vis);
    win = get_glx_window(dpy, vis, false);

    ctx = glXCreateContextAttribsARB(dpy, config, NULL, true,
                                     context_attribs);

    glXMakeCurrent(dpy, win, ctx);

    if (epoxy_is_desktop_gl()) {
        errx(1, "GLES2 context creation made a desktop context\n");
    }

    if (epoxy_gl_version() < 20) {
        errx(1, "GLES2 context creation made a version %f context\n",
             epoxy_gl_version() / 10.0f);
    }

    /* Test using an entrypoint that's in GLES2, but not the desktop GL ABI. */
    shader = glCreateShader(GL_FRAGMENT_SHADER);
    if (shader == 0)
        errx(1, "glCreateShader() failed\n");
    glDeleteShader(shader);

    if (epoxy_gl_version() >= 30) {
        GLuint q = 0;

        glGenQueries(1, &q);
        if (!q)
            errx(1, "glGenQueries() failed\n");
        glDeleteQueries(1, &q);
    }

    return pass != true;
}